

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exit_code.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  char *str;
  char *substring_success;
  char *substring_failure;
  char **argv_local;
  int argc_local;
  
  __s1 = argv[1];
  if (argc < 2) {
    argv_local._4_4_ = 1;
  }
  else {
    iVar1 = strcmp(__s1,"zero_exit");
    if (iVar1 == 0) {
      argv_local._4_4_ = 0;
    }
    else {
      iVar1 = strcmp(__s1,"non_zero_exit");
      if (iVar1 == 0) {
        argv_local._4_4_ = 1;
      }
      else {
        fprintf(_stderr,"Failed to find string \'%s\' in \'%s\'\n","zero_exit",__s1);
        argv_local._4_4_ = 1;
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[])
{
  const char* substring_failure = "non_zero_exit";
  const char* substring_success = "zero_exit";
  const char* str = argv[1];
  if (argc < 2) {
    return EXIT_FAILURE;
  }
  if (strcmp(str, substring_success) == 0) {
    return EXIT_SUCCESS;
  }
  if (strcmp(str, substring_failure) == 0) {
    return EXIT_FAILURE;
  }
  fprintf(stderr, "Failed to find string '%s' in '%s'\n", substring_success,
          str);
  return EXIT_FAILURE;
}